

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzFind.c
# Opt level: O2

void Bt3_MatchFinder_Skip(void *_p,UInt32 num)

{
  uint lenLimit;
  UInt32 curMatch;
  undefined4 uVar1;
  byte *cur;
  long lVar2;
  int iVar3;
  ulong uVar4;
  uint uVar5;
  
  do {
    lenLimit = *(uint *)((long)_p + 0x14);
    if (lenLimit < 3) {
      MatchFinder_MovePos((CMatchFinder *)_p);
    }
    else {
      cur = *_p;
      uVar5 = (uint)cur[1] ^ *(uint *)((long)_p + (ulong)*cur * 4 + 0x78);
      uVar4 = (ulong)(((uint)cur[2] << 8 ^ uVar5) & *(uint *)((long)_p + 0x38));
      lVar2 = *(long *)((long)_p + 0x28);
      curMatch = *(UInt32 *)(lVar2 + 0x1000 + uVar4 * 4);
      uVar1 = *(undefined4 *)((long)_p + 8);
      *(undefined4 *)(lVar2 + 0x1000 + uVar4 * 4) = uVar1;
      *(undefined4 *)(lVar2 + (ulong)(uVar5 & 0x3ff) * 4) = uVar1;
      SkipMatchesSpec(lenLimit,curMatch,*(UInt32 *)((long)_p + 8),cur,*(CLzRef **)((long)_p + 0x30),
                      (ulong)*(uint *)((long)_p + 0x18),*(UInt32 *)((long)_p + 0x1c),
                      *(UInt32 *)((long)_p + 0x3c));
      *(int *)((long)_p + 0x18) = *(int *)((long)_p + 0x18) + 1;
      *(long *)_p = *_p + 1;
      iVar3 = *(int *)((long)_p + 8) + 1;
      *(int *)((long)_p + 8) = iVar3;
      if (iVar3 == *(int *)((long)_p + 0xc)) {
        MatchFinder_CheckLimits((CMatchFinder *)_p);
      }
    }
    num = num - 1;
  } while (num != 0);
  return;
}

Assistant:

static void Bt3_MatchFinder_Skip(void *_p, UInt32 num)
{
  CMatchFinder *p = (CMatchFinder *)_p;
  SKIP_HEADER(3)
  {
    UInt32 h2;
    UInt32 *hash;
    HASH3_CALC
    hash = p->hash;
    curMatch = (hash + kFix3HashSize)[hv];
    hash[h2] =
    (hash + kFix3HashSize)[hv] = p->pos;
  }
  SKIP_FOOTER
}